

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O2

int lws_add_http_header_status(lws *wsi,uint _code,uchar **p,uchar *end)

{
  short sVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  char **ppcVar9;
  char *pcVar10;
  lws_protocol_vhost_options *plVar11;
  uint uVar12;
  uchar code_and_desc [60];
  
  uVar12 = _code & 0xffff;
  if ((wsi->role_ops == &role_ops_h2) || ((wsi->wsistate & 0xf000000) == 0x1000000)) {
    iVar4 = lws_add_http2_header_status(wsi,_code & 0xffff,p,end);
    if (iVar4 != 0) {
      return iVar4;
    }
    goto LAB_0011d455;
  }
  uVar5 = (_code & 0xffff) - 400;
  if (uVar5 < 0x12) {
    ppcVar9 = err400;
LAB_0011d3a5:
    pcVar6 = ppcVar9[uVar5];
  }
  else {
    uVar5 = (_code & 0xffff) - 500;
    if (uVar5 < 6) {
      ppcVar9 = err500;
      goto LAB_0011d3a5;
    }
    pcVar6 = "";
  }
  pcVar10 = "Continue";
  if (uVar12 != 100) {
    pcVar10 = pcVar6;
  }
  pcVar6 = "OK";
  if (uVar12 != 200) {
    pcVar6 = pcVar10;
  }
  pcVar10 = "Redirect";
  if (99 < (_code & 0xffff) - 300) {
    pcVar10 = pcVar6;
  }
  pcVar6 = "Not Modified";
  if (uVar12 != 0x130) {
    pcVar6 = pcVar10;
  }
  uVar7 = (ulong)(wsi->http).request_version;
  if (uVar7 < 3) {
    pcVar10 = lws_add_http_header_status_hver_rel +
              *(int *)(lws_add_http_header_status_hver_rel + uVar7 * 4);
  }
  else {
    pcVar10 = "HTTP/1.0";
  }
  iVar4 = lws_snprintf((char *)code_and_desc,0x3b,"%s %u %s",pcVar10,(ulong)(ushort)_code,pcVar6);
  iVar4 = lws_add_http_header_by_name(wsi,(uchar *)0x0,code_and_desc,iVar4,p,end);
  if (iVar4 != 0) {
    return 1;
  }
LAB_0011d455:
  plVar11 = (lws_protocol_vhost_options *)&wsi->vhost->headers;
  while (plVar11 = plVar11->next, plVar11 != (lws_protocol_vhost_options *)0x0) {
    puVar2 = (uchar *)plVar11->name;
    puVar3 = (uchar *)plVar11->value;
    sVar8 = strlen((char *)puVar3);
    iVar4 = lws_add_http_header_by_name(wsi,puVar2,puVar3,(int)sVar8,p,end);
    if (iVar4 != 0) {
      return 1;
    }
  }
  if ((wsi->vhost->options & 0x10000000) != 0) {
    for (plVar11 = pvo_hsbph + 4; plVar11 != (lws_protocol_vhost_options *)0x0;
        plVar11 = plVar11->next) {
      puVar2 = (uchar *)plVar11->name;
      puVar3 = (uchar *)plVar11->value;
      sVar8 = strlen((char *)puVar3);
      iVar4 = lws_add_http_header_by_name(wsi,puVar2,puVar3,(int)sVar8,p,end);
      if (iVar4 != 0) {
        return 1;
      }
    }
  }
  puVar2 = (uchar *)wsi->context->server_string;
  if (((byte)(_code >> 0x1e) & 1) == 0 && puVar2 != (uchar *)0x0) {
    sVar1 = wsi->context->server_string_len;
    if (sVar1 < 1) {
      __assert_fail("wsi->context->server_string_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/header.c"
                    ,0x164,
                    "int lws_add_http_header_status(struct lws *, unsigned int, unsigned char **, unsigned char *)"
                   );
    }
    iVar4 = lws_add_http_header_by_token(wsi,WSI_TOKEN_HTTP_SERVER,puVar2,(int)sVar1,p,end);
    if (iVar4 != 0) {
      return 1;
    }
  }
  if (((wsi->vhost->options & 0x8000) != 0) &&
     (iVar4 = lws_add_http_header_by_name
                        (wsi,(uchar *)"Strict-Transport-Security:",
                         (uchar *)"max-age=15768000 ; includeSubDomains",0x24,p,end), iVar4 != 0)) {
    return 1;
  }
  if (end + -2 <= *p) {
    _lws_log(1,"%s: reached end of buffer\n","lws_add_http_header_status");
    return 1;
  }
  return 0;
}

Assistant:

int
lws_add_http_header_status(struct lws *wsi, unsigned int _code,
			   unsigned char **p, unsigned char *end)
{
	static const char * const hver[] = {
		"HTTP/1.0", "HTTP/1.1", "HTTP/2"
	};
	const struct lws_protocol_vhost_options *headers;
	unsigned int code = _code & LWSAHH_CODE_MASK;
	const char *description = "", *p1;
	unsigned char code_and_desc[60];
	int n;

#ifdef LWS_WITH_ACCESS_LOG
	wsi->http.access_log.response = code;
#endif

#ifdef LWS_WITH_HTTP2
	if (lwsi_role_h2(wsi) || lwsi_role_h2_ENCAPSULATION(wsi)) {
		n = lws_add_http2_header_status(wsi, code, p, end);
		if (n)
			return n;
	} else
#endif
	{
		if (code >= 400 && code < (400 + LWS_ARRAY_SIZE(err400)))
			description = err400[code - 400];
		if (code >= 500 && code < (500 + LWS_ARRAY_SIZE(err500)))
			description = err500[code - 500];

		if (code == 100)
			description = "Continue";
		if (code == 200)
			description = "OK";
		if (code == 304)
			description = "Not Modified";
		else
			if (code >= 300 && code < 400)
				description = "Redirect";

		if (wsi->http.request_version < LWS_ARRAY_SIZE(hver))
			p1 = hver[wsi->http.request_version];
		else
			p1 = hver[0];

		n = lws_snprintf((char *)code_and_desc,
				 sizeof(code_and_desc) - 1, "%s %u %s",
				 p1, code, description);

		if (lws_add_http_header_by_name(wsi, NULL, code_and_desc, n, p,
						end))
			return 1;
	}

	headers = wsi->vhost->headers;
	while (headers) {
		if (lws_add_http_header_by_name(wsi,
				(const unsigned char *)headers->name,
				(unsigned char *)headers->value,
				(int)strlen(headers->value), p, end))
			return 1;

		headers = headers->next;
	}

	if (wsi->vhost->options &
	    LWS_SERVER_OPTION_HTTP_HEADERS_SECURITY_BEST_PRACTICES_ENFORCE) {
		headers = &pvo_hsbph[LWS_ARRAY_SIZE(pvo_hsbph) - 1];
		while (headers) {
			if (lws_add_http_header_by_name(wsi,
					(const unsigned char *)headers->name,
					(unsigned char *)headers->value,
					(int)strlen(headers->value), p, end))
				return 1;

			headers = headers->next;
		}
	}

	if (wsi->context->server_string &&
	    !(_code & LWSAHH_FLAG_NO_SERVER_NAME)) {
		assert(wsi->context->server_string_len > 0);
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_SERVER,
				(unsigned char *)wsi->context->server_string,
				wsi->context->server_string_len, p, end))
			return 1;
	}

	if (wsi->vhost->options & LWS_SERVER_OPTION_STS)
		if (lws_add_http_header_by_name(wsi, (unsigned char *)
				"Strict-Transport-Security:",
				(unsigned char *)"max-age=15768000 ; "
				"includeSubDomains", 36, p, end))
			return 1;

	if (*p >= (end - 2)) {
		lwsl_err("%s: reached end of buffer\n", __func__);

		return 1;
	}

	return 0;
}